

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CreateLink(string *origName,string *newName,string *errorMessage)

{
  char *pcVar1;
  char *new_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string e;
  undefined1 local_1e0 [4];
  int err;
  uv_fs_t req;
  string *errorMessage_local;
  string *newName_local;
  string *origName_local;
  
  req.bufsml[3].len = (size_t)errorMessage;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  new_path = (char *)std::__cxx11::string::c_str();
  e.field_2._12_4_ = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)local_1e0,pcVar1,new_path,(uv_fs_cb)0x0)
  ;
  if (e.field_2._12_4_ == 0) {
    origName_local._7_1_ = true;
  }
  else {
    std::operator+(&local_248,"failed to create link \'",newName);
    std::operator+(&local_228,&local_248,"\': ");
    pcVar1 = uv_strerror(e.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &local_228,pcVar1);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    if (req.bufsml[3].len == 0) {
      Error((string *)local_208);
    }
    else {
      std::__cxx11::string::operator=((string *)req.bufsml[3].len,(string *)local_208);
    }
    origName_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_208);
  }
  return origName_local._7_1_;
}

Assistant:

bool cmSystemTools::CreateLink(const std::string& origName,
                               const std::string& newName,
                               std::string* errorMessage)
{
  uv_fs_t req;
  int err =
    uv_fs_link(nullptr, &req, origName.c_str(), newName.c_str(), nullptr);
  if (err) {
    std::string e =
      "failed to create link '" + newName + "': " + uv_strerror(err);
    if (errorMessage) {
      *errorMessage = std::move(e);
    } else {
      cmSystemTools::Error(e);
    }
    return false;
  }

  return true;
}